

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.hh
# Opt level: O2

void __thiscall Game::load_maze(Game *this)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Direction DVar4;
  Position PVar5;
  State *o;
  char cVar6;
  uint uVar7;
  istream *this_00;
  undefined8 extraout_RAX;
  Position PVar8;
  int iVar9;
  size_type __n;
  long lVar10;
  int iVar11;
  undefined1 auVar12 [11];
  undefined1 auVar15 [16];
  undefined1 auVar20 [16];
  char cell;
  int cols;
  int rows;
  allocator_type local_2d2;
  allocator_type local_2d1;
  Position local_2d0;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [20];
  bool local_2a4;
  int local_2a0;
  int local_29c;
  int local_298;
  undefined8 local_294;
  undefined8 uStack_28c;
  _Insert<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  *local_280;
  State *local_278;
  vector<Ghost_State,_std::allocator<Ghost_State>_> *local_270;
  _Insert<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  *local_268;
  long local_260;
  char dummy;
  ifstream maze_file;
  uint auStack_220 [124];
  undefined1 auVar13 [12];
  undefined1 auVar16 [16];
  undefined1 auVar14 [13];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar18 [16];
  
  this->loaded_maze = true;
  std::ifstream::ifstream((string *)&maze_file);
  std::ifstream::open((string *)&maze_file,0x1204b8);
  cVar6 = std::__basic_file<char>::is_open();
  if (cVar6 != '\0') {
    this_00 = (istream *)std::istream::operator>>((istream *)&maze_file,&rows);
    std::istream::operator>>(this_00,&cols);
    Matrix<char>::Matrix((Matrix<char> *)local_2c8,rows,cols,'\0');
    local_278 = &this->state;
    Matrix<char>::operator=(&local_278->maze,(Matrix<char> *)local_2c8);
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::~vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               *)(local_2c8 + 8));
    __n = (size_type)rows;
    _cell = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&dummy,(long)cols,(value_type_conflict1 *)&cell,
               &local_2d1);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)local_2c8,__n,(value_type *)&dummy,&local_2d2);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::_M_move_assign(&PathMagic::index_from_pos,
                     (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)local_2c8);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)local_2c8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&dummy);
    if (State::valid_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        State::valid_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
        super__Vector_impl_data._M_start) {
      State::valid_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_finish =
           State::valid_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    if (State::valid_positions_no_spawn.super__Vector_base<Position,_std::allocator<Position>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        State::valid_positions_no_spawn.super__Vector_base<Position,_std::allocator<Position>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      State::valid_positions_no_spawn.super__Vector_base<Position,_std::allocator<Position>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           State::valid_positions_no_spawn.super__Vector_base<Position,_std::allocator<Position>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    puVar1 = (uint *)((long)auStack_220 + *(long *)(_maze_file + -0x18));
    *puVar1 = *puVar1 & 0xffffefff;
    local_280 = (_Insert<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                 *)&(this->state).pills;
    local_268 = (_Insert<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                 *)&(this->state).powerpills;
    local_270 = &(this->state).ghosts;
    local_2d0.i = 0;
    local_2d0.j = 0;
    iVar11 = 0;
    while( true ) {
      if ((long)rows <= (long)local_2d0) break;
      std::operator>>((istream *)&maze_file,&dummy);
      PVar5 = local_2d0;
      PVar8 = local_2d0;
      for (lVar10 = 0; lVar10 < cols; lVar10 = lVar10 + 1) {
        std::operator>>((istream *)&maze_file,&cell);
        cVar6 = cell;
        if (cell == 'G') {
          cVar6 = ' ';
        }
        if (cell == 'P') {
          cVar6 = ' ';
        }
        *(char *)(*(long *)&(this->state).maze.t.
                            super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)PVar5].
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data + lVar10) = cVar6;
        auVar20[0] = -(cell == '.');
        auVar12._0_10_ = (unkuint10)0xffffff << 0x38;
        auVar12[10] = 0xff;
        auVar13[0xb] = 0xff;
        auVar13._0_11_ = auVar12;
        auVar14[0xc] = 0xff;
        auVar14._0_12_ = auVar13;
        auVar19[0xd] = 0xff;
        auVar19._0_13_ = auVar14;
        auVar19[0xe] = 0xff;
        auVar19[0xf] = 0xff;
        auVar18._14_2_ = auVar19._14_2_;
        auVar18[0xd] = 0xff;
        auVar18._0_13_ = auVar14;
        auVar17._13_3_ = auVar18._13_3_;
        auVar17[0xc] = 0xff;
        auVar17._0_12_ = auVar13;
        auVar16._12_4_ = auVar17._12_4_;
        auVar16[0xb] = 0xff;
        auVar16._0_11_ = auVar12;
        auVar15._11_5_ = auVar16._11_5_;
        auVar15[10] = 0xff;
        auVar15._0_10_ = auVar12._0_10_;
        auVar20._8_8_ =
             (undefined8)(CONCAT72((int7)(CONCAT63(auVar15._10_6_,0xffffff) >> 0x10),0xffff) >> 8);
        auVar20[7] = 0xff;
        auVar20[6] = 0xff;
        auVar20[5] = 0xff;
        auVar20[4] = 0xff;
        auVar20[3] = -(cell == 'o');
        auVar20[2] = -(cell == 'o');
        auVar20[1] = auVar20[0];
        auVar20 = pshuflw(auVar20,auVar20,0xd4);
        auVar20 = auVar20 & _DAT_001150a0;
        uVar2 = (this->state).n_normal_pills_left;
        uVar3 = (this->state).n_powerpills_left;
        (this->state).n_normal_pills_left = uVar2 + auVar20._0_4_;
        (this->state).n_powerpills_left = uVar3 + auVar20._4_4_;
        if (cell == '.') {
          local_2c8._0_4_ =
               (int)((ulong)((long)State::valid_positions.
                                   super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)State::valid_positions.
                                  super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3);
          std::__detail::
          _Insert<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
          ::insert(local_280,(value_type *)local_2c8);
        }
        else if (cell == 'o') {
          local_2c8._0_4_ =
               (undefined4)
               ((ulong)((long)State::valid_positions.
                              super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)State::valid_positions.
                             super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
          local_260 = lVar10;
          std::__detail::
          _Insert<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
          ::insert(local_268,(value_type *)local_2c8);
          local_2c8._0_4_ =
               (int)((ulong)((long)State::valid_positions.
                                   super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)State::valid_positions.
                                  super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3);
          std::__detail::
          _Insert<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
          ::insert(local_280,(value_type *)local_2c8);
          lVar10 = local_260;
        }
        if (cell != '%') {
          iVar9 = (int)lVar10;
          local_2c8._4_4_ = iVar9;
          local_2c8._0_4_ = local_2d0.i;
          std::vector<Position,_std::allocator<Position>_>::emplace_back<Position>
                    (&State::valid_positions,(Position *)local_2c8);
          uVar7 = _cell & 0xff;
          if (((_cell & 0xff) != 0x47) && ((_cell & 0xff) != 0x58)) {
            local_2c8._0_4_ = local_2d0.i;
            std::vector<Position,_std::allocator<Position>_>::emplace_back<Position>
                      (&State::valid_positions_no_spawn,(Position *)local_2c8);
            uVar7 = _cell & 0xff;
          }
          PathMagic::index_from_pos.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)PVar5].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [lVar10] = iVar11;
          DVar4 = Direction::UP;
          iVar11 = iVar11 + 1;
          if ((char)uVar7 == 'G') {
            *(undefined1 *)
             (*(long *)&(this->state).maze.t.
                        super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)PVar5].
                        super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data + lVar10) = 0x58;
            local_2c8._8_4_ = -1;
            local_2c8._12_4_ = -1;
            local_2b8._0_4_ = Direction::UP.i;
            local_2b8._4_4_ = Direction::UP.j;
            local_2b8._8_4_ = 0.0;
            local_2a4 = false;
            local_2a0 = 0;
            local_29c = Arguments::initial_scatter_cycle_rounds;
            local_298 = Arguments::initial_chase_cycle_rounds;
            local_294._0_4_ = CHASE;
            local_294._4_4_ = -1;
            uStack_28c._0_4_ = -1;
            uStack_28c._4_4_ = 0;
            local_2c8._0_8_ = PVar8;
            local_2b8._12_8_ = PVar8;
            std::vector<Ghost_State,_std::allocator<Ghost_State>_>::emplace_back<Ghost_State>
                      (local_270,(Ghost_State *)local_2c8);
            local_2c8._0_8_ = operator_new(8);
            *(undefined ***)local_2c8._0_8_ = &PTR_take_action_0011faf8;
            std::vector<Agent*,std::allocator<Agent*>>::emplace_back<Agent*>
                      ((vector<Agent*,std::allocator<Agent*>> *)this,(Agent **)local_2c8);
          }
          else if (uVar7 == 0x50) {
            (this->state).pacman.pos.i = local_2d0.i;
            (this->state).pacman.pos.j = iVar9;
            (this->state).pacman.prev.i = -1;
            (this->state).pacman.prev.j = -1;
            (this->state).pacman.dir.i = DVar4.i;
            (this->state).pacman.dir.j = DVar4.j;
            (this->state).pacman.step = 0.0;
          }
        }
        PVar8 = (Position)((long)PVar8 + 0x100000000);
      }
      local_2d0 = (Position)((long)local_2d0 + 1);
    }
    State::total_normal_pills = (this->state).n_normal_pills_left;
    State::total_powerpills = (this->state).n_powerpills_left;
    State::total_pills = State::total_powerpills + State::total_normal_pills;
    State::distribution_valid_pos_no_spawn._M_param =
         (param_type)
         (((long)State::valid_positions_no_spawn.
                 super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)State::valid_positions_no_spawn.
                 super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                 super__Vector_impl_data._M_start & 0xfffffffffffffff8U) * 0x20000000 + -0x100000000
         );
    State::n_ghosts =
         (int)(((long)(this->state).ghosts.
                      super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->state).ghosts.
                     super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x44);
    SeenMatrix::init((SeenMatrix *)(long)rows,(EVP_PKEY_CTX *)(ulong)(uint)cols);
    o = local_278;
    PathMagic::compute(local_278);
    RL_Pacman_Agent_Inputs::precompute();
    State::operator=(&this->initialState,o);
    std::ifstream::~ifstream(&maze_file);
    return;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                 "Invalid maze file path \'",&Arguments::maze_path_abi_cxx11_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,"\'");
  error((string *)local_2c8);
  std::__cxx11::string::~string((string *)&dummy);
  std::ifstream::~ifstream(&maze_file);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void load_maze() {
        loaded_maze = true;

        ifstream maze_file;
        maze_file.open(Arguments::maze_path);

        if (not maze_file.is_open())
            error("Invalid maze file path '" + Arguments::maze_path + "'");

        int rows, cols;
        maze_file >> rows >> cols;
        state.maze = Matrix<char>(rows, cols);
        uint valid_index = 0;
        PathMagic::index_from_pos = vector<vector<int>>(rows, vector<int>(cols, -1));
        State::valid_positions.clear();
        State::valid_positions_no_spawn.clear();

        maze_file >> std::noskipws;
        for (int i = 0; i < rows; ++i) {
            char dummy; maze_file >> dummy;
            for (int j = 0; j < cols; ++j) {
                char cell; maze_file >> cell;
                state.maze[i][j] = cell != State::PACMAN and cell != State::GHOST ? cell : State::FREE;

                state.n_normal_pills_left += cell == State::PILL;
                state.n_powerpills_left += cell == State::POWER_PILL;

                if (cell == State::POWER_PILL) {
                    state.powerpills.insert(state.valid_positions.size());
                    state.pills.insert(state.valid_positions.size());
                }
                else if (cell == State::PILL) {
                    state.pills.insert(state.valid_positions.size());
                }

                if (cell != State::WALL) {
                    state.valid_positions.push_back(Position(i, j));
                    if (cell != State::SPAWN_AREA and cell != State::GHOST) state.valid_positions_no_spawn.push_back(Position(i, j));
                    PathMagic::index_from_pos[i][j] = valid_index++;
                }

                if (cell == State::PACMAN) state.pacman = Agent_State(Position(i, j), Direction::UP);
                else if (cell == State::GHOST) {
                    state.maze[i][j] = State::SPAWN_AREA;
                    state.ghosts.push_back(Ghost_State(Position(i, j), Direction::UP));
                    ghosts.push_back((Agent*)new Ghost_Agent());
                }
            }
        }

        state.total_pills = state.n_normal_pills_left + state.n_powerpills_left;
        state.total_powerpills = state.n_powerpills_left;
        state.total_normal_pills = state.n_normal_pills_left;
        state.distribution_valid_pos_no_spawn = uniform_int_distribution<>(0, state.valid_positions_no_spawn.size() - 1);
        state.n_ghosts = state.ghosts.size();

        SeenMatrix::init(rows, cols);
        PathMagic::compute(state);
        RL_Pacman_Agent_Inputs::precompute();

        initialState = state;
    }